

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderVariableManagerVk::BindResource
          (ShaderVariableManagerVk *this,Uint32 ResIndex,BindResourceInfo *BindInfo)

{
  BindResourceHelper BindHelper;
  BindResourceHelper local_50;
  
  anon_unknown_77::BindResourceHelper::BindResourceHelper
            (&local_50,
             (this->
             super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
             ).m_pSignature,
             (this->
             super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
             ).m_ResourceCache,ResIndex,BindInfo->ArrayIndex);
  anon_unknown_77::BindResourceHelper::operator()(&local_50,BindInfo);
  return;
}

Assistant:

void ShaderVariableManagerVk::BindResource(Uint32 ResIndex, const BindResourceInfo& BindInfo)
{
    BindResourceHelper BindHelper{
        *m_pSignature,
        m_ResourceCache,
        ResIndex,
        BindInfo.ArrayIndex};

    BindHelper(BindInfo);
}